

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenGlobalInitializer::generate(cmQtAutoGenGlobalInitializer *this)

{
  pointer puVar1;
  bool bVar2;
  bool bVar3;
  pointer puVar4;
  
  bVar2 = InitializeCustomTargets(this);
  if (bVar2) {
    puVar4 = (this->Initializers_).
             super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->Initializers_).
             super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = puVar4 == puVar1;
    if ((!bVar2) &&
       (bVar3 = cmQtAutoGenInitializer::SetupCustomTargets
                          ((puVar4->_M_t).
                           super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                           .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl),
       bVar3)) {
      do {
        puVar4 = puVar4 + 1;
        bVar2 = puVar4 == puVar1;
        if (bVar2) {
          return bVar2;
        }
        bVar3 = cmQtAutoGenInitializer::SetupCustomTargets
                          ((puVar4->_M_t).
                           super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                           .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl);
      } while (bVar3);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenGlobalInitializer::generate()
{
  return (InitializeCustomTargets() && SetupCustomTargets());
}